

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-invert-images.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar4;
  byte bVar5;
  int iVar6;
  ImageInverter *this_00;
  reference ppVar7;
  long lVar8;
  ostream *poVar9;
  char *local_208;
  exception *e;
  QPDFWriter w;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_1e8;
  QPDFObjectHandle local_1d8;
  byte local_1c3;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  undefined1 local_178 [8];
  QPDFObjectHandle bits_per_component;
  string local_160 [32];
  undefined1 local_140 [8];
  QPDFObjectHandle color_space;
  QPDFObjectHandle image_dict;
  QPDFObjectHandle *image;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *iter;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range2;
  QPDFPageObjectHelper *page;
  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
  local_b8;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_88 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_70;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  ImageInverter *inv;
  QPDF local_40 [8];
  QPDF qpdf;
  char *password;
  char *outfilename;
  char *infilename;
  char **ppcStack_18;
  bool static_id;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  bVar3 = false;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if ((1 < argc) && (iVar6 = strcmp(argv[1]," --static-id"), iVar6 == 0)) {
    bVar3 = true;
    argv_local._0_4_ = argc + -1;
    ppcStack_18 = argv + 1;
  }
  if (((int)argv_local != 3) && ((int)argv_local != 4)) {
    usage();
  }
  pcVar1 = ppcStack_18[1];
  pcVar2 = ppcStack_18[2];
  if ((int)argv_local == 4) {
    local_208 = ppcStack_18[3];
  }
  else {
    local_208 = "";
  }
  _qpdf = local_208;
  QPDF::QPDF(local_40);
  QPDF::processFile((char *)local_40,pcVar1);
  this_00 = (ImageInverter *)operator_new(0x40);
  ImageInverter::ImageInverter(this_00);
  p.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr<ImageInverter,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&__range1,this_00);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1,local_40);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_70 = local_88;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_70)
  ;
  local_b8._M_current =
       (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_70);
  while (bVar4 = __gnu_cxx::operator!=(&__end1,&local_b8), bVar4) {
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator*(&__end1);
    QPDFPageObjectHelper::getImages_abi_cxx11_();
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)&__begin2);
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     *)&__begin2);
    while (bVar4 = std::operator!=(&__end2,(_Self *)&iter), bVar4) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
               ::operator*(&__end2);
      QPDFObjectHandle::getDict();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"/ColorSpace",
                 (allocator<char> *)
                 ((long)&bits_per_component.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((string *)local_140);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&bits_per_component.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_198,"/BitsPerComponent",&local_199);
      QPDFObjectHandle::getKey((string *)local_178);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
      local_1c2 = 0;
      local_1c3 = 0;
      bVar5 = QPDFObjectHandle::pipeStreamData
                        ((Pipeline *)&ppVar7->second,0,qpdf_dl_generalized,true,false);
      bVar4 = false;
      if ((bVar5 & 1) != 0) {
        std::allocator<char>::allocator();
        local_1c2 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_1c0,"/DeviceGray",&local_1c1);
        local_1c3 = 1;
        bVar5 = QPDFObjectHandle::isNameAndEquals((string *)local_140);
        bVar4 = false;
        if ((bVar5 & 1) != 0) {
          bVar5 = QPDFObjectHandle::isInteger();
          bVar4 = false;
          if ((bVar5 & 1) != 0) {
            lVar8 = QPDFObjectHandle::getIntValue();
            bVar4 = lVar8 == 8;
          }
        }
      }
      if ((local_1c3 & 1) != 0) {
        std::__cxx11::string::~string(local_1c0);
      }
      if ((local_1c2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_1c1);
      }
      this._M_pi = p.
                   super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
      if (bVar4) {
        QPDFObjectHandle::QPDFObjectHandle(&local_1d8,&ppVar7->second);
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
                  (&local_1e8,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&__range1);
        ImageInverter::registerImage((ImageInverter *)this._M_pi,&local_1d8,&local_1e8);
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_1e8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_1d8);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_178);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_140);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &color_space.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            *)&__begin2);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_88);
  QPDFWriter::QPDFWriter((QPDFWriter *)&e,local_40,pcVar2);
  if (bVar3) {
    QPDFWriter::setStaticID(SUB81(&e,0));
  }
  QPDFWriter::write();
  poVar9 = std::operator<<((ostream *)&std::cout,whoami);
  poVar9 = std::operator<<(poVar9,": new file written to ");
  poVar9 = std::operator<<(poVar9,pcVar2);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  QPDFWriter::~QPDFWriter((QPDFWriter *)&e);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&__range1);
  QPDF::~QPDF(local_40);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    bool static_id = false;
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (!((argc == 3) || (argc == 4))) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* password = (argc == 4) ? argv[3] : "";

    try {
        QPDF qpdf;
        qpdf.processFile(infilename, password);

        auto* inv = new ImageInverter;
        auto p = std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(inv);

        // For each page...
        for (auto& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Get all images on the page.
            for (auto& iter: page.getImages()) {
                QPDFObjectHandle& image = iter.second;
                QPDFObjectHandle image_dict = image.getDict();
                QPDFObjectHandle color_space = image_dict.getKey("/ColorSpace");
                QPDFObjectHandle bits_per_component = image_dict.getKey("/BitsPerComponent");

                // For our example, we can only work with 8-bit grayscale images that we can fully
                // decode.  Use pipeStreamData with a null pipeline to determine whether the image
                // is filterable.  Directly inspect keys to determine the image type.
                if (image.pipeStreamData(nullptr, qpdf_ef_compress, qpdf_dl_all) &&
                    color_space.isNameAndEquals("/DeviceGray") && bits_per_component.isInteger() &&
                    (bits_per_component.getIntValue() == 8)) {
                    inv->registerImage(image, p);
                }
            }
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            w.setStaticID(true); // for testing only
        }
        w.write();
        std::cout << whoami << ": new file written to " << outfilename << std::endl;
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}